

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool MeCab::Viterbi::buildAllLattice(Lattice *lattice)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long *in_RDI;
  Node *node;
  long pos;
  Node **begin_node_list;
  size_t len;
  Node *prev;
  long *local_38;
  long local_30;
  long *local_18;
  
  uVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,0x20);
  if ((uVar1 & 1) != 0) {
    local_18 = (long *)(**(code **)(*in_RDI + 0x10))();
    lVar2 = (**(code **)(*in_RDI + 0x58))();
    lVar3 = (**(code **)(*in_RDI + 0x20))();
    for (local_30 = 0; local_30 <= lVar2; local_30 = local_30 + 1) {
      for (local_38 = *(long **)(lVar3 + local_30 * 8); local_38 != (long *)0x0;
          local_38 = (long *)local_38[3]) {
        local_18[1] = (long)local_38;
        *local_38 = (long)local_18;
        local_18 = local_38;
      }
    }
  }
  return true;
}

Assistant:

bool Viterbi::buildAllLattice(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_ALL_MORPHS)) {
    return true;
  }

  Node *prev = lattice->bos_node();
  const size_t len = lattice->size();
  Node **begin_node_list = lattice->begin_nodes();

  for (long pos = 0; pos <= static_cast<long>(len); ++pos) {
    for (Node *node = begin_node_list[pos]; node; node = node->bnext) {
      prev->next = node;
      node->prev = prev;
      prev = node;
    }
  }

  return true;
}